

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O2

errno_t strcpy_s(char *_Dst,size_t _SizeInBytes,char *_Src)

{
  char cVar1;
  ulong uVar2;
  
  if (_Dst != (char *)0x0 && _SizeInBytes != 0) {
    if (_Src != (char *)0x0) {
      uVar2 = 0;
      do {
        cVar1 = _Src[uVar2];
        _Dst[uVar2] = cVar1;
        if (cVar1 == '\0') {
          if (_SizeInBytes <= uVar2 + 1) {
            return 0;
          }
          memset(_Dst + uVar2 + 1,0xfd,~uVar2 + _SizeInBytes);
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (_SizeInBytes != uVar2);
      *_Dst = '\0';
      if (1 < _SizeInBytes) {
        memset(_Dst + 1,0xfd,_SizeInBytes - 1);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      return 0x22;
    }
    *_Dst = '\0';
    if (1 < _SizeInBytes) {
      memset(_Dst + 1,0xfd,_SizeInBytes - 1);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return 0x16;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strcpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src)
{

    char *p;
    size_t available;

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    while ((*p++ = *_Src++) != 0 && --available > 0)
    {
    }

    if (available == 0)
    {
       _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
       _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }

    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}